

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_cast.hpp
# Opt level: O2

string * __thiscall
boost::unit_test::utils::string_cast<boost::unit_test::basic_cstring<char_const>>
          (string *__return_storage_ptr__,utils *this,basic_cstring<const_char> *t)

{
  ostringstream buff;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  unit_test::operator<<
            ((basic_ostream<char,_std::char_traits<char>_> *)local_190,
             (basic_cstring<const_char> *)this);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

inline std::string
string_cast( T const& t )
{
    std::ostringstream buff;
    buff << t;
    return buff.str();
}